

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglframebufferobject.cpp
# Opt level: O0

bool __thiscall QOpenGLFramebufferObject::isBound(QOpenGLFramebufferObject *this)

{
  long lVar1;
  GLuint GVar2;
  long lVar3;
  long in_FS_OFFSET;
  QOpenGLContext *ctx;
  QOpenGLFramebufferObjectPrivate *d;
  GLint fbo;
  GLenum in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  GLuint GVar4;
  undefined1 local_d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QOpenGLFramebufferObject *)0x14a615);
  lVar3 = QOpenGLContext::currentContext();
  if (lVar3 == 0) {
    local_d = false;
  }
  else {
    QOpenGLContext::functions();
    QOpenGLFunctions::glGetIntegerv
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,(GLint *)0x14a657);
    GVar4 = 0;
    GVar2 = QOpenGLFramebufferObjectPrivate::fbo
                      ((QOpenGLFramebufferObjectPrivate *)(ulong)in_stack_ffffffffffffffd0);
    local_d = GVar4 == GVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLFramebufferObject::isBound() const
{
    Q_D(const QOpenGLFramebufferObject);
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (!ctx)
        return false;
    GLint fbo = 0;
    ctx->functions()->glGetIntegerv(GL_FRAMEBUFFER_BINDING, &fbo);
    return GLuint(fbo) == d->fbo();
}